

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_line(CPState *cp,BCLine hashline)

{
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar1;
  bool bVar2;
  BCLine newline;
  BCLine hashline_local;
  CPState *cp_local;
  
  aVar1 = (cp->val).field_0;
  while( true ) {
    bVar2 = false;
    if (cp->tok != 0x103) {
      bVar2 = cp->linenumber == hashline;
    }
    if (!bVar2) break;
    cp_next(cp);
  }
  cp->linenumber = (BCLine)aVar1;
  return;
}

Assistant:

static void cp_line(CPState *cp, BCLine hashline)
{
  BCLine newline = cp->val.u32;
  /* TODO: Handle file name and include it in error messages. */
  while (cp->tok != CTOK_EOF && cp->linenumber == hashline)
    cp_next(cp);
  cp->linenumber = newline;
}